

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

uint __thiscall ON_PolyCurve::SizeOf(ON_PolyCurve *this)

{
  ON_Curve *pOVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  uVar2 = ON_Curve::SizeOf(&this->super_ON_Curve);
  uVar2 = uVar2 + ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_capacity +
                  (this->m_t).m_capacity) * 8 + 0x30;
  lVar4 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar5];
      if (pOVar1 != (ON_Curve *)0x0) {
        iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[8])();
        uVar2 = uVar2 + iVar3;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  return uVar2;
}

Assistant:

unsigned int ON_PolyCurve::SizeOf() const
{
  unsigned int sz = ON_Curve::SizeOf();
  sz += (sizeof(*this) - sizeof(ON_Curve));
  sz += m_t.SizeOfArray();
  sz += m_segment.SizeOfArray();
  int i, count = m_segment.Count();
  for ( i = 0; i < count; i++ )
  {
    const ON_Curve* crv = m_segment[i];
    if ( crv )
      sz += crv->SizeOf();
  }
  return sz;
}